

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

socket_t __thiscall httplib::ClientImpl::create_client_socket(ClientImpl *this,Error *error)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  SocketOptions socket_options;
  SocketOptions socket_options_00;
  anon_class_32_4_f0d0a25b bind_or_connect;
  anon_class_32_4_f0d0a25b bind_or_connect_00;
  code *pcVar4;
  time_t *ptVar5;
  socket_t sVar6;
  Error EVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  code *pcVar10;
  time_t local_a0;
  time_t local_98;
  string *local_90;
  Error *pEStack_88;
  _Manager_type local_80;
  _Invoker_type p_Stack_78;
  _Any_data local_70;
  code *local_60;
  time_t *ptStack_58;
  _Any_data local_50;
  code *local_40;
  time_t *ptStack_38;
  
  pEStack_88 = error;
  if (((this->proxy_host_)._M_string_length == 0) || (iVar2 = this->proxy_port_, iVar2 == -1)) {
    pcVar3 = (this->host_)._M_dataplus._M_p;
    iVar2 = this->port_;
    bVar1 = this->tcp_nodelay_;
    std::function<void_(int)>::function((function<void_(int)> *)&local_70,&this->socket_options_);
    ptVar5 = ptStack_58;
    pcVar4 = local_60;
    local_98 = this->connection_timeout_sec_;
    local_a0 = this->connection_timeout_usec_;
    local_90 = &this->interface_;
    uVar8 = (void *)0x0;
    uVar9 = 0;
    pcVar10 = (code *)0x0;
    if (local_60 != (code *)0x0) {
      local_60 = (code *)0x0;
      ptStack_58 = (time_t *)0x0;
      uVar8 = local_70._M_unused._0_8_;
      uVar9 = local_70._8_8_;
      pcVar10 = pcVar4;
    }
    local_80 = (_Manager_type)&local_98;
    p_Stack_78 = (_Invoker_type)&local_a0;
    socket_options_00.super__Function_base._M_functor._8_8_ = error;
    socket_options_00.super__Function_base._M_functor._M_unused._M_object = local_90;
    socket_options_00.super__Function_base._M_manager = local_80;
    socket_options_00._M_invoker = p_Stack_78;
    bind_or_connect_00.error = (Error *)uVar9;
    bind_or_connect_00.intf = (string *)uVar8;
    bind_or_connect_00.timeout_sec = (time_t *)pcVar10;
    bind_or_connect_00.timeout_usec = ptVar5;
    sVar6 = detail::
            create_socket<httplib::detail::create_client_socket(char_const*,int,bool,std::function<void(int)>,long,long,std::__cxx11::string_const&,httplib::Error&)::_lambda(int,addrinfo&)_1_>
                      (pcVar3,iVar2,0,bVar1,socket_options_00,bind_or_connect_00);
    if (pcVar10 != (code *)0x0) {
      (*pcVar10)((_Any_data *)&stack0xffffffffffffff38,(_Any_data *)&stack0xffffffffffffff38,
                 __destroy_functor);
    }
    EVar7 = Success;
    if (sVar6 == -1) {
      if (*error != Success) goto LAB_0011842f;
      EVar7 = Connection;
    }
    *error = EVar7;
LAB_0011842f:
    if (local_60 == (code *)0x0) {
      return sVar6;
    }
    (*local_60)(&local_70,&local_70,__destroy_functor);
    return sVar6;
  }
  pcVar3 = (this->proxy_host_)._M_dataplus._M_p;
  bVar1 = this->tcp_nodelay_;
  std::function<void_(int)>::function((function<void_(int)> *)&local_50,&this->socket_options_);
  ptVar5 = ptStack_38;
  pcVar4 = local_40;
  local_98 = this->connection_timeout_sec_;
  local_a0 = this->connection_timeout_usec_;
  local_90 = &this->interface_;
  uVar8 = (void *)0x0;
  uVar9 = 0;
  pcVar10 = (code *)0x0;
  if (local_40 != (code *)0x0) {
    local_40 = (code *)0x0;
    ptStack_38 = (time_t *)0x0;
    uVar8 = local_50._M_unused._0_8_;
    uVar9 = local_50._8_8_;
    pcVar10 = pcVar4;
  }
  local_80 = (_Manager_type)&local_98;
  p_Stack_78 = (_Invoker_type)&local_a0;
  socket_options.super__Function_base._M_functor._8_8_ = error;
  socket_options.super__Function_base._M_functor._M_unused._M_object = local_90;
  socket_options.super__Function_base._M_manager = local_80;
  socket_options._M_invoker = p_Stack_78;
  bind_or_connect.error = (Error *)uVar9;
  bind_or_connect.intf = (string *)uVar8;
  bind_or_connect.timeout_sec = (time_t *)pcVar10;
  bind_or_connect.timeout_usec = ptVar5;
  sVar6 = detail::
          create_socket<httplib::detail::create_client_socket(char_const*,int,bool,std::function<void(int)>,long,long,std::__cxx11::string_const&,httplib::Error&)::_lambda(int,addrinfo&)_1_>
                    (pcVar3,iVar2,0,bVar1,socket_options,bind_or_connect);
  if (pcVar10 != (code *)0x0) {
    (*pcVar10)((_Any_data *)&stack0xffffffffffffff38,(_Any_data *)&stack0xffffffffffffff38,
               __destroy_functor);
  }
  EVar7 = Success;
  if (sVar6 == -1) {
    if (*error != Success) goto LAB_00118452;
    EVar7 = Connection;
  }
  *error = EVar7;
LAB_00118452:
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  return sVar6;
}

Assistant:

inline socket_t ClientImpl::create_client_socket(Error &error) const {
		if (!proxy_host_.empty() && proxy_port_ != -1) {
			return detail::create_client_socket(
					proxy_host_.c_str(), proxy_port_, tcp_nodelay_, socket_options_,
					connection_timeout_sec_, connection_timeout_usec_, interface_, error);
		}
		return detail::create_client_socket(
				host_.c_str(), port_, tcp_nodelay_, socket_options_,
				connection_timeout_sec_, connection_timeout_usec_, interface_, error);
	}